

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

buffer_appender<char>
fmt::v7::detail::write<char,fmt::v7::detail::buffer_appender<char>>
          (buffer_appender<char> out,char value)

{
  buffer_appender<char> this;
  char value_local;
  
  this = reserve<char>(out,1);
  buffer<char>::push_back
            ((buffer<char> *)
             this.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,&value_local)
  ;
  return (buffer_appender<char>)
         this.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container.container;
}

Assistant:

OutputIt write(OutputIt out, Char value) {
  auto it = reserve(out, 1);
  *it++ = value;
  return base_iterator(out, it);
}